

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

void __thiscall Rml::BaseXMLParser::ReadBody(BaseXMLParser *this)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  String *pSVar4;
  int iVar5;
  String temp;
  
  this->line_number_open_tag = 0;
  this->open_tag_depth = 0;
LAB_002518ef:
  while( true ) {
    bVar3 = FindString(this,"<",&this->data,true);
    if (!bVar3) goto LAB_002519bd;
    sVar2 = this->xml_index;
    bVar3 = PeekString(this,"!--",true);
    if (!bVar3) break;
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    bVar3 = FindString(this,"-->",&temp,false);
    ::std::__cxx11::string::~string((string *)&temp);
    if (!bVar3) {
LAB_002519bd:
      iVar5 = this->open_tag_depth;
LAB_002519c0:
      if (0 < iVar5) {
        uVar1 = this->line_number;
        pSVar4 = URL::GetURL_abi_cxx11_(this->source_url);
        Log::Message(LT_WARNING,"XML parse error on line %d of %s.",(ulong)uVar1,
                     (pSVar4->_M_dataplus)._M_p);
      }
      return;
    }
  }
  bVar3 = PeekString(this,"![CDATA[",true);
  if (bVar3) {
    bVar3 = ReadCDATA(this,(char *)0x0);
  }
  else {
    bVar3 = PeekString(this,"/",true);
    if (bVar3) {
      bVar3 = ReadCloseTag(this,sVar2 - 1);
      iVar5 = this->open_tag_depth;
      if ((!bVar3) || (iVar5 == 0)) goto LAB_002519c0;
      goto LAB_002518ef;
    }
    bVar3 = ReadOpenTag(this);
  }
  if (bVar3 == false) goto LAB_002519bd;
  goto LAB_002518ef;
}

Assistant:

void BaseXMLParser::ReadBody()
{
	RMLUI_ZoneScoped;

	open_tag_depth = 0;
	line_number_open_tag = 0;

	for (;;)
	{
		// Find the next open tag.
		if (!FindString("<", data, true))
			break;

		const size_t xml_index_tag = xml_index - 1;

		// Check what kind of tag this is.
		if (PeekString("!--"))
		{
			// Comment.
			String temp;
			if (!FindString("-->", temp))
				break;
		}
		else if (PeekString("![CDATA["))
		{
			// CDATA tag; read everything (including markup) until the ending
			// CDATA tag.
			if (!ReadCDATA())
				break;
		}
		else if (PeekString("/"))
		{
			if (!ReadCloseTag(xml_index_tag))
				break;

			// Bail if we've hit the end of the XML data.
			if (open_tag_depth == 0)
				break;
		}
		else
		{
			if (!ReadOpenTag())
				break;
		}
	}

	// Check for error conditions
	if (open_tag_depth > 0)
	{
		Log::Message(Log::LT_WARNING, "XML parse error on line %d of %s.", GetLineNumber(), source_url->GetURL().c_str());
	}
}